

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  void *__s;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  undefined1 *__src;
  uint __c;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *__src_00;
  int local_60;
  
  uVar1 = dst->w;
  lVar5 = (long)(int)uVar1;
  iVar2 = dst->h;
  __src = (undefined1 *)src->data;
  __s = dst->data;
  if (type == 0) {
    __c = (uint)(byte)v;
    iVar8 = top;
    if (top < 1) {
      iVar7 = 0;
    }
    else {
      do {
        if (0 < (int)uVar1) {
          memset(__s,__c,(ulong)uVar1);
        }
        __s = (void *)((long)__s + lVar5);
        iVar8 = iVar8 + -1;
        iVar7 = top;
      } while (iVar8 != 0);
    }
    if (iVar7 < src->h + top) {
      lVar6 = (long)left;
      uVar4 = 0;
      if (0 < left) {
        uVar4 = (ulong)(uint)left;
      }
      do {
        uVar11 = 0;
        if (0 < left) {
          memset(__s,__c,(ulong)(uint)left);
          uVar11 = (ulong)(uint)left;
        }
        if ((long)src->w < 0xc) {
          uVar10 = uVar4;
          if ((int)uVar11 < src->w + left) {
            do {
              *(undefined1 *)((long)__s + uVar10) = __src[uVar10 - lVar6];
              uVar11 = uVar10 + 1;
              uVar10 = uVar11;
            } while ((long)uVar11 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),__src,(long)src->w);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        uVar9 = (uint)uVar11;
        if ((int)uVar9 < (int)uVar1) {
          memset((void *)((long)(int)uVar9 + (long)__s),__c,(ulong)(~uVar9 + uVar1) + 1);
        }
        __src = __src + src->w;
        __s = (void *)((long)__s + lVar5);
        iVar7 = iVar7 + 1;
      } while (iVar7 < src->h + top);
    }
    local_60 = iVar2 - iVar7;
    if (local_60 != 0 && iVar7 <= iVar2) {
      do {
        if (0 < (int)uVar1) {
          memset(__s,__c,(ulong)uVar1);
        }
        __s = (void *)((long)__s + lVar5);
        local_60 = local_60 + -1;
      } while (local_60 != 0);
    }
  }
  else if (type == 1) {
    lVar6 = (long)left;
    uVar4 = (ulong)(uint)left;
    if (top < 1) {
      iVar8 = 0;
    }
    else {
      iVar7 = 0;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar11 = 0;
          do {
            *(undefined1 *)((long)__s + uVar11) = *__src;
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar11 < src->w + left) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar11) = __src[uVar11 - lVar6];
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),__src,(long)src->w);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        if ((int)uVar11 < (int)uVar1) {
          lVar3 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar3) = __src[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar5 != lVar3);
        }
        __s = (void *)((long)__s + lVar5);
        iVar7 = iVar7 + 1;
        iVar8 = top;
      } while (iVar7 != top);
    }
    if (iVar8 < src->h + top) {
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar11 = 0;
          do {
            *(undefined1 *)((long)__s + uVar11) = *__src;
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar11 < src->w + left) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar11) = __src[uVar11 - lVar6];
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),__src,(long)src->w);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        if ((int)uVar11 < (int)uVar1) {
          lVar3 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar3) = __src[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar5 != lVar3);
        }
        __src = __src + src->w;
        __s = (void *)((long)__s + lVar5);
        iVar8 = iVar8 + 1;
      } while (iVar8 < src->h + top);
    }
    if (iVar8 < iVar2) {
      iVar7 = src->w;
      __src_00 = __src + -(long)iVar7;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar11 = 0;
          do {
            *(undefined1 *)((long)__s + uVar11) = *__src_00;
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar11 < src->w + left) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar11) = __src[uVar11 + (-lVar6 - (long)iVar7)];
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),__src_00,(long)src->w);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        if ((int)uVar11 < (int)uVar1) {
          lVar3 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar3) = __src_00[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar5 != lVar3);
        }
        __s = (void *)((long)__s + lVar5);
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
}